

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

Node * __thiscall
MeCab::anon_unknown_0::TaggerImpl::parseToNode(TaggerImpl *this,char *str,size_t len)

{
  char *pcVar1;
  int iVar2;
  Lattice *pLVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  pLVar3 = mutable_lattice(this);
  (*pLVar3->_vptr_Lattice[10])(pLVar3,str,len);
  initRequestType(this);
  iVar2 = (**(this->super_Tagger)._vptr_Tagger)(this);
  if ((char)iVar2 != '\0') {
    iVar2 = (*pLVar3->_vptr_Lattice[2])();
    return (Node *)CONCAT44(extraout_var,iVar2);
  }
  iVar2 = (*pLVar3->_vptr_Lattice[0x24])(pLVar3);
  pcVar1 = (char *)(this->what_)._M_string_length;
  strlen((char *)CONCAT44(extraout_var_00,iVar2));
  std::__cxx11::string::_M_replace((ulong)&this->what_,0,pcVar1,CONCAT44(extraout_var_00,iVar2));
  return (Node *)0x0;
}

Assistant:

const Node *TaggerImpl::parseToNode(const char *str, size_t len) {
  Lattice *lattice = mutable_lattice();
  lattice->set_sentence(str, len);
  initRequestType();
  if (!parse(lattice)) {
    set_what(lattice->what());
    return 0;
  }
  return lattice->bos_node();
}